

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

ctmbstr prvTidygetNextPriorityAttr(TidyDocImpl *doc,TidyIterator *iter)

{
  TidyIterator local_38;
  ctmbstr local_30;
  ctmbstr result;
  size_t index;
  PriorityAttribs *priorities;
  TidyIterator *iter_local;
  TidyDocImpl *doc_local;
  
  local_30 = (ctmbstr)0x0;
  if (iter != (TidyIterator *)0x0) {
    result = (ctmbstr)*iter;
    if (((TidyIterator)result != (TidyIterator)0x0) &&
       (result <= (TidyIterator)(ulong)(doc->attribs).priorityAttribs.count)) {
      local_30 = (doc->attribs).priorityAttribs.list
                 [(long)((long)&((TidyIterator)((long)result + -4))->_opaque + 3)];
      result = (ctmbstr)((long)&((TidyIterator)result)->_opaque + 1);
    }
    if ((ctmbstr)(ulong)(doc->attribs).priorityAttribs.count < result) {
      local_38 = (TidyIterator)0x0;
    }
    else {
      local_38 = (TidyIterator)result;
    }
    *iter = local_38;
    return local_30;
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/attrs.c"
                ,1000,"ctmbstr prvTidygetNextPriorityAttr(TidyDocImpl *, TidyIterator *)");
}

Assistant:

ctmbstr  TY_(getNextPriorityAttr)( TidyDocImpl* doc, TidyIterator* iter )
{
    PriorityAttribs *priorities = &(doc->attribs.priorityAttribs);
    size_t index;
    ctmbstr result = NULL;
    assert( iter != NULL );
    index = (size_t)*iter;

    if ( index > 0 && index <= priorities->count )
    {
        result = priorities->list[index-1];
        index++;
    }
    *iter = (TidyIterator) ( index <= priorities->count ? index : (size_t)0 );

    return result;
}